

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::
SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed>
::~SmallVectorImpl(SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed>
                   *this)

{
  bool bVar1;
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed>
  *this_local;
  
  SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_false>
  ::destroy_range((Unparsed *)
                  (this->
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_false>
                  ).
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_void>
                  .super_SmallVectorBase.BeginX,
                  (Unparsed *)
                  (this->
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_false>
                  ).
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_void>
                  .super_SmallVectorBase.EndX);
  bVar1 = SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_void>
          ::isSmall((SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_void>
                     *)this);
  if (!bVar1) {
    free((this->
         super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_false>
         ).
         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_void>
         .super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      free(this->begin());
  }